

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_feat_resist_flag(parser *p)

{
  int iVar1;
  parser_error pVar2;
  void *pvVar3;
  char *flag_name;
  
  pvVar3 = parser_priv(p);
  flag_name = parser_getsym(p,"flag");
  iVar1 = lookup_flag(mon_race_flags,flag_name);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (iVar1 == 0) {
    pVar2 = PARSE_ERROR_INVALID_FLAG;
  }
  else {
    *(int *)((long)pvVar3 + 0x70) = iVar1;
    pVar2 = PARSE_ERROR_NONE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_feat_resist_flag(struct parser *p) {
	struct feature *f = parser_priv(p);
	int flag = lookup_flag(mon_race_flags, parser_getsym(p, "flag"));

	if (!f) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (flag == FLAG_END) {
		return PARSE_ERROR_INVALID_FLAG;
	}
	f->resist_flag = flag;
	return PARSE_ERROR_NONE;
}